

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O3

void do_x25519(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int i;
  long lVar20;
  long lVar21;
  char cVar22;
  limb_t *plVar23;
  limb_t *plVar24;
  uint uVar25;
  bool bVar26;
  byte bVar27;
  int iVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  char cVar31;
  char cVar32;
  char cVar33;
  byte bVar34;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  uint uVar35;
  byte bVar39;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  uint uVar40;
  byte bVar44;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  uint uVar45;
  byte bVar49;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  uint uVar50;
  mg res;
  mg T;
  fld_t T2;
  fld_t T1;
  fld_t sqsumA;
  fld_t T3;
  fld_t subA;
  fld_t sumA;
  fld_t subB;
  fld_t sumB;
  fld_t sqsubA;
  mg P;
  ulong local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  ulong uStack_2d0;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  limb_t local_250 [5];
  limb_t local_228 [6];
  limb_t local_1f8 [6];
  limb_t local_1c8 [6];
  limb_t local_198 [6];
  limb_t local_168 [6];
  limb_t local_138 [6];
  limb_t local_108 [6];
  limb_t local_d8 [6];
  limb_t local_a8 [5];
  limb_t local_80 [5];
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  bVar27 = 0;
  uStack_2e0 = *(undefined8 *)(scalar + 8);
  local_2d8 = *(undefined8 *)(scalar + 0x10);
  local_2e8 = *(ulong *)scalar & 0xfffffffffffffff8;
  uStack_2d0 = *(ulong *)(scalar + 0x18) & 0x3fffffffffffffff | 0x4000000000000000;
  fld_import(local_80,point);
  local_58 = 1;
  local_50 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  _local_2c8 = 1;
  local_2c0 = (undefined1  [16])0x0;
  local_2b0 = (undefined1  [16])0x0;
  local_2a0 = (undefined1  [16])0x0;
  local_290 = (undefined1  [16])0x0;
  local_280 = 0;
  plVar23 = local_80;
  plVar24 = (limb_t *)&local_278;
  for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *plVar24 = *plVar23;
    plVar23 = plVar23 + (ulong)bVar27 * -2 + 1;
    plVar24 = plVar24 + (ulong)bVar27 * -2 + 1;
  }
  lVar21 = 0x1f;
  do {
    cVar22 = *(char *)((long)&local_2e8 + lVar21);
    uVar25 = 8;
    do {
      auVar30 = pshuflw(ZEXT216(CONCAT11(cVar22,cVar22)),ZEXT216(CONCAT11(cVar22,cVar22)),0);
      iVar28 = auVar30._0_4_;
      cVar31 = auVar30[0];
      cVar32 = auVar30[1];
      cVar33 = auVar30[2];
      lVar20 = 0;
      do {
        bVar27 = *(byte *)((long)&local_278 + lVar20);
        bVar1 = *(byte *)((long)&local_278 + lVar20 + 1);
        bVar2 = *(byte *)((long)&local_278 + lVar20 + 2);
        bVar3 = *(byte *)((long)&local_278 + lVar20 + 3);
        bVar4 = *(byte *)((long)&uStack_274 + lVar20);
        bVar5 = *(byte *)((long)&uStack_274 + lVar20 + 1);
        bVar6 = *(byte *)((long)&uStack_274 + lVar20 + 2);
        bVar7 = *(byte *)((long)&uStack_274 + lVar20 + 3);
        bVar8 = *(byte *)((long)&local_270 + lVar20);
        bVar9 = *(byte *)((long)&local_270 + lVar20 + 1);
        bVar10 = *(byte *)((long)&local_270 + lVar20 + 2);
        bVar11 = *(byte *)((long)&local_270 + lVar20 + 3);
        bVar12 = *(byte *)((long)&uStack_26c + lVar20);
        bVar13 = *(byte *)((long)&uStack_26c + lVar20 + 1);
        bVar14 = *(byte *)((long)&uStack_26c + lVar20 + 2);
        bVar15 = *(byte *)((long)&uStack_26c + lVar20 + 3);
        bVar34 = (bVar27 ^ local_2c0[lVar20 + -8]) & -(cVar31 < '\0');
        bVar36 = (bVar1 ^ local_2c0[lVar20 + -7]) & -(cVar32 < '\0');
        bVar37 = (bVar2 ^ local_2c0[lVar20 + -6]) & -(cVar33 < '\0');
        bVar38 = (bVar3 ^ local_2c0[lVar20 + -5]) & -(iVar28 < 0);
        bVar39 = (bVar4 ^ local_2c0[lVar20 + -4]) & -(cVar31 < '\0');
        bVar41 = (bVar5 ^ local_2c0[lVar20 + -3]) & -(cVar32 < '\0');
        bVar42 = (bVar6 ^ local_2c0[lVar20 + -2]) & -(cVar33 < '\0');
        bVar43 = (bVar7 ^ local_2c0[lVar20 + -1]) & -(iVar28 < 0);
        bVar44 = (bVar8 ^ local_2c0[lVar20]) & -(cVar31 < '\0');
        bVar46 = (bVar9 ^ local_2c0[lVar20 + 1]) & -(cVar32 < '\0');
        bVar47 = (bVar10 ^ local_2c0[lVar20 + 2]) & -(cVar33 < '\0');
        bVar48 = (bVar11 ^ local_2c0[lVar20 + 3]) & -(iVar28 < 0);
        bVar49 = (bVar12 ^ local_2c0[lVar20 + 4]) & -(cVar31 < '\0');
        bVar51 = (bVar13 ^ local_2c0[lVar20 + 5]) & -(cVar32 < '\0');
        bVar52 = (bVar14 ^ local_2c0[lVar20 + 6]) & -(cVar33 < '\0');
        bVar53 = (bVar15 ^ local_2c0[lVar20 + 7]) & -(iVar28 < 0);
        local_2c0[lVar20 + -8] = local_2c0[lVar20 + -8] ^ bVar34;
        local_2c0[lVar20 + -7] = local_2c0[lVar20 + -7] ^ bVar36;
        local_2c0[lVar20 + -6] = local_2c0[lVar20 + -6] ^ bVar37;
        local_2c0[lVar20 + -5] = local_2c0[lVar20 + -5] ^ bVar38;
        local_2c0[lVar20 + -4] = local_2c0[lVar20 + -4] ^ bVar39;
        local_2c0[lVar20 + -3] = local_2c0[lVar20 + -3] ^ bVar41;
        local_2c0[lVar20 + -2] = local_2c0[lVar20 + -2] ^ bVar42;
        local_2c0[lVar20 + -1] = local_2c0[lVar20 + -1] ^ bVar43;
        local_2c0[lVar20] = local_2c0[lVar20] ^ bVar44;
        local_2c0[lVar20 + 1] = local_2c0[lVar20 + 1] ^ bVar46;
        local_2c0[lVar20 + 2] = local_2c0[lVar20 + 2] ^ bVar47;
        local_2c0[lVar20 + 3] = local_2c0[lVar20 + 3] ^ bVar48;
        local_2c0[lVar20 + 4] = local_2c0[lVar20 + 4] ^ bVar49;
        local_2c0[lVar20 + 5] = local_2c0[lVar20 + 5] ^ bVar51;
        local_2c0[lVar20 + 6] = local_2c0[lVar20 + 6] ^ bVar52;
        local_2c0[lVar20 + 7] = local_2c0[lVar20 + 7] ^ bVar53;
        *(byte *)((long)&local_278 + lVar20) = bVar34 ^ bVar27;
        *(byte *)((long)&local_278 + lVar20 + 1) = bVar36 ^ bVar1;
        *(byte *)((long)&local_278 + lVar20 + 2) = bVar37 ^ bVar2;
        *(byte *)((long)&local_278 + lVar20 + 3) = bVar38 ^ bVar3;
        *(byte *)((long)&uStack_274 + lVar20) = bVar39 ^ bVar4;
        *(byte *)((long)&uStack_274 + lVar20 + 1) = bVar41 ^ bVar5;
        *(byte *)((long)&uStack_274 + lVar20 + 2) = bVar42 ^ bVar6;
        *(byte *)((long)&uStack_274 + lVar20 + 3) = bVar43 ^ bVar7;
        *(byte *)((long)&local_270 + lVar20) = bVar44 ^ bVar8;
        *(byte *)((long)&local_270 + lVar20 + 1) = bVar46 ^ bVar9;
        *(byte *)((long)&local_270 + lVar20 + 2) = bVar47 ^ bVar10;
        *(byte *)((long)&local_270 + lVar20 + 3) = bVar48 ^ bVar11;
        *(byte *)((long)&uStack_26c + lVar20) = bVar49 ^ bVar12;
        *(byte *)((long)&uStack_26c + lVar20 + 1) = bVar51 ^ bVar13;
        *(byte *)((long)&uStack_26c + lVar20 + 2) = bVar52 ^ bVar14;
        *(byte *)((long)&uStack_26c + lVar20 + 3) = bVar53 ^ bVar15;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x50);
      lVar20 = 0;
      do {
        local_138[lVar20] =
             *(long *)(local_2a0 + lVar20 * 8) + *(long *)(local_2c0 + lVar20 * 8 + -8);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_sq(local_1c8,local_138);
      lVar20 = 0;
      do {
        local_168[lVar20] =
             *(long *)(local_2c0 + lVar20 * 8 + -8) - *(long *)(local_2a0 + lVar20 * 8);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_sq(local_a8,local_168);
      fld_mul((limb_t *)&local_2c8,local_a8,local_1c8);
      lVar20 = 0;
      do {
        local_1f8[lVar20] = local_1c8[lVar20] - local_a8[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_scale(local_228,local_1f8,0x1db41);
      lVar20 = 0;
      do {
        local_228[lVar20] = local_228[lVar20] + local_1c8[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_mul((limb_t *)local_2a0,local_1f8,local_228);
      lVar20 = 0;
      do {
        local_d8[lVar20] = local_250[lVar20] + *(long *)(&local_278 + lVar20 * 2);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      lVar20 = 0;
      do {
        local_108[lVar20] = *(long *)(&local_278 + lVar20 * 2) - local_250[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_mul(local_1f8,local_168,local_d8);
      fld_mul(local_228,local_138,local_108);
      lVar20 = 0;
      do {
        local_198[lVar20] = local_228[lVar20] + local_1f8[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_sq((limb_t *)&local_278,local_198);
      lVar20 = 0;
      do {
        local_198[lVar20] = local_1f8[lVar20] - local_228[lVar20];
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      fld_sq(local_198,local_198);
      fld_mul(local_250,local_198,local_80);
      auVar30 = ZEXT216(CONCAT11(cVar22 >> 7,cVar22 >> 7));
      auVar30 = pshuflw(auVar30,auVar30,0);
      uVar29 = auVar30._0_4_;
      lVar20 = 0;
      do {
        uVar16 = *(uint *)((long)&local_278 + lVar20);
        uVar17 = *(uint *)((long)&uStack_274 + lVar20);
        uVar18 = *(uint *)((long)&local_270 + lVar20);
        uVar19 = *(uint *)((long)&uStack_26c + lVar20);
        uVar35 = (uVar16 ^ *(uint *)(local_2c0 + lVar20 + -8)) & uVar29;
        uVar40 = (uVar17 ^ *(uint *)(local_2c0 + lVar20 + -4)) & uVar29;
        uVar45 = (uVar18 ^ *(uint *)(local_2c0 + lVar20)) & uVar29;
        uVar50 = (uVar19 ^ *(uint *)(local_2c0 + lVar20 + 4)) & uVar29;
        *(uint *)(local_2c0 + lVar20 + -8) = *(uint *)(local_2c0 + lVar20 + -8) ^ uVar35;
        *(uint *)(local_2c0 + lVar20 + -4) = *(uint *)(local_2c0 + lVar20 + -4) ^ uVar40;
        *(uint *)(local_2c0 + lVar20) = *(uint *)(local_2c0 + lVar20) ^ uVar45;
        *(uint *)(local_2c0 + lVar20 + 4) = *(uint *)(local_2c0 + lVar20 + 4) ^ uVar50;
        *(uint *)((long)&local_278 + lVar20) = uVar35 ^ uVar16;
        *(uint *)((long)&uStack_274 + lVar20) = uVar40 ^ uVar17;
        *(uint *)((long)&local_270 + lVar20) = uVar45 ^ uVar18;
        *(uint *)((long)&uStack_26c + lVar20) = uVar50 ^ uVar19;
        lVar20 = lVar20 + 0x10;
      } while (lVar20 != 0x50);
      cVar22 = cVar22 * '\x02';
      bVar26 = 1 < uVar25;
      uVar25 = uVar25 - 1;
    } while (bVar26);
    bVar26 = lVar21 != 0;
    lVar21 = lVar21 + -1;
  } while (bVar26);
  fld_inv((limb_t *)local_2a0,(limb_t *)local_2a0);
  fld_mul((limb_t *)&local_2c8,(limb_t *)&local_2c8,(limb_t *)local_2a0);
  fld_export(out,(limb_t *)&local_2c8);
  return;
}

Assistant:

static void
do_x25519(uint8_t out[X25519_KEY_LEN],
	     const uint8_t scalar[X25519_KEY_LEN],
	     const uint8_t point[X25519_KEY_LEN])
{
	struct mg res, P;
	uint8_t s[X25519_KEY_LEN];

	memcpy(s, scalar, X25519_KEY_LEN);
	s[0] &= 0xf8;
	s[31] &= 0x7f;
	s[31] |= 0x40;
 	
	fld_import(P.x, point);
	fld_set0(P.z, 1);
	
	mg_scale(&res, &P, s);

	fld_inv(res.z, res.z);
	fld_mul(res.x, res.x, res.z);
	fld_export(out, res.x);
}